

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O1

LY_ERR lys_identity_iffeature_value(lysc_ident *ident)

{
  lysp_ident *plVar1;
  lysp_module *plVar2;
  lysp_include *plVar3;
  lysp_ident *plVar4;
  lysp_ident *plVar5;
  LY_ERR LVar6;
  lysp_ident *plVar7;
  ulong uVar8;
  char *pcVar9;
  lysp_ident *plVar10;
  ulong uVar11;
  ulong uVar12;
  ly_bool enabled;
  ly_bool local_9;
  
  if (ident == (lysc_ident *)0x0) {
    pcVar9 = "ident";
  }
  else {
    plVar2 = ident->module->parsed;
    if (plVar2 != (lysp_module *)0x0) {
      plVar10 = plVar2->identities;
      plVar7 = plVar10 + -1;
      uVar8 = 0xffffffffffffffff;
      while( true ) {
        if (plVar10 == (lysp_ident *)0x0) {
          uVar11 = 0;
        }
        else {
          uVar11 = *(ulong *)&plVar10[-1].flags;
        }
        uVar8 = uVar8 + 1;
        if (uVar11 <= uVar8) break;
        plVar4 = plVar7 + 1;
        plVar7 = plVar7 + 1;
        if (plVar4->name == ident->name) {
LAB_001558dd:
          if (plVar7 == (lysp_ident *)0x0) {
            plVar3 = plVar2->includes;
            plVar7 = (lysp_ident *)0x0;
            uVar8 = 0;
            while( true ) {
              if (plVar3 == (lysp_include *)0x0) {
                uVar11 = 0;
              }
              else {
                uVar11 = *(ulong *)(plVar3[-1].rev + 8);
              }
              if (uVar11 <= uVar8) break;
              plVar4 = (plVar3[uVar8].submodule)->identities;
              plVar10 = plVar4 + -1;
              uVar11 = 0xffffffffffffffff;
              do {
                if (plVar4 == (lysp_ident *)0x0) {
                  uVar12 = 0;
                }
                else {
                  uVar12 = *(ulong *)&plVar4[-1].flags;
                }
                uVar11 = uVar11 + 1;
                plVar5 = plVar7;
              } while ((uVar11 < uVar12) &&
                      (plVar1 = plVar10 + 1, plVar10 = plVar10 + 1, plVar5 = plVar10,
                      plVar1->name != ident->name));
              plVar7 = plVar5;
              uVar8 = uVar8 + 1;
            }
          }
          if (plVar7 == (lysp_ident *)0x0) {
            __assert_fail("found_ident",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_features.c"
                          ,0x85,"LY_ERR lys_identity_iffeature_value(const struct lysc_ident *)");
          }
          LVar6 = lys_eval_iffeatures(ident->module->ctx,plVar7->iffeatures,&local_9);
          if (LVar6 != LY_SUCCESS) {
            return LVar6;
          }
          if (local_9 == '\0') {
            return LY_ENOT;
          }
          return LY_SUCCESS;
        }
      }
      plVar7 = (lysp_ident *)0x0;
      goto LAB_001558dd;
    }
    pcVar9 = "ident->module->parsed";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar9,
         "lys_identity_iffeature_value");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_identity_iffeature_value(const struct lysc_ident *ident)
{
    LY_ARRAY_COUNT_TYPE u, v;
    ly_bool enabled;
    const struct lysp_ident *idents_p, *found_ident = NULL;
    struct lysp_include *includes;

    LY_CHECK_ARG_RET(NULL, ident, ident->module->parsed, LY_EINVAL);

    /* Search parsed identity in the module. */
    idents_p = ident->module->parsed->identities;
    LY_ARRAY_FOR(idents_p, u) {
        if (idents_p[u].name == ident->name) {
            found_ident = &idents_p[u];
            break;
        }
    }

    if (!found_ident) {
        /* It is not in the module, so it must be in some submodule. */
        includes = ident->module->parsed->includes;
        LY_ARRAY_FOR(includes, u) {
            idents_p = includes[u].submodule->identities;
            LY_ARRAY_FOR(idents_p, v) {
                if (idents_p[v].name == ident->name) {
                    found_ident = &idents_p[v];
                    break;
                }
            }
        }
    }

    assert(found_ident);

    /* Evaluate its if-feature. */
    LY_CHECK_RET(lys_eval_iffeatures(ident->module->ctx, found_ident->iffeatures, &enabled));
    if (!enabled) {
        return LY_ENOT;
    }

    return LY_SUCCESS;
}